

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_util.hpp
# Opt level: O3

uint8_t * __thiscall EntryBTree::parseData(EntryBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  bVar1 = *data;
  pbVar3 = data + 2;
  key->m_flags = (uint)bVar1;
  uVar8 = (ulong)data[1];
  if ((char)data[1] < '\0') {
    uVar7 = 0x80;
    do {
      bVar2 = *pbVar3;
      lVar5 = uVar8 - uVar7;
      pbVar3 = pbVar3 + 1;
      uVar7 = uVar7 << 7;
      uVar6 = lVar5 * 0x100;
      uVar8 = bVar2 | uVar6;
    } while ((uVar6 & uVar7) != 0);
  }
  key->m_nameIndex = (uint32_t)uVar8;
  uVar8 = 0;
  if ((bVar1 & 2) != 0) {
    bVar1 = *pbVar3;
    uVar8 = (ulong)bVar1;
    pbVar3 = pbVar3 + 1;
    if ((char)bVar1 < '\0') {
      uVar7 = 0x80;
      do {
        bVar1 = *pbVar3;
        lVar5 = uVar8 - uVar7;
        pbVar3 = pbVar3 + 1;
        uVar7 = uVar7 << 7;
        uVar6 = lVar5 * 0x100;
        uVar8 = bVar1 | uVar6;
      } while ((uVar6 & uVar7) != 0);
    }
  }
  key->m_extIndex = (uint32_t)uVar8;
  uVar8 = (ulong)*pbVar3;
  pbVar4 = pbVar3 + 1;
  if ((char)*pbVar3 < '\0') {
    uVar7 = 0x80;
    do {
      bVar1 = *pbVar4;
      lVar5 = uVar8 - uVar7;
      pbVar4 = pbVar4 + 1;
      uVar7 = uVar7 << 7;
      uVar6 = lVar5 * 0x100;
      uVar8 = bVar1 | uVar6;
    } while ((uVar6 & uVar7) != 0);
  }
  key->m_linkIndex = (uint32_t)uVar8;
  return pbVar4;
}

Assistant:

inline T read(const CharT* buffer)
{
	T value;
	std::memcpy(&value, buffer, sizeof(value));
	return value;
}